

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::interface_to_endpoints
          (aux *this,listen_interface_t *iface,listen_socket_flags_t flags,
          span<const_libtorrent::aux::ip_interface> ifs,
          vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
          *eps)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  int *piVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  undefined7 in_register_00000011;
  address *a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__cp;
  long lVar7;
  ip_interface *piVar8;
  size_t __n;
  ulong uVar9;
  ip_interface *__begin3;
  bool bVar10;
  transport ssl;
  bytes_type bytes;
  address adr;
  char src_buf [64];
  bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> local_d2;
  aux local_d1;
  ip_interface *local_d0;
  int *local_c8;
  vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
  *local_c0;
  char local_b8;
  byte bStack_b7;
  undefined2 uStack_b6;
  undefined4 uStack_b4;
  size_type sStack_b0;
  address local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [2];
  
  a = (address *)CONCAT71(in_register_00000011,flags.m_val);
  local_c0 = (vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
              *)ifs.m_len;
  local_d2.m_val = (char)this[0x25] * '\x02' | (byte)iface;
  local_d1 = this[0x24];
  __s = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this;
  local_c8 = __errno_location();
  *local_c8 = 0;
  pcVar6 = strchr((char *)__s,0x25);
  __cp = __s;
  local_80 = __s;
  if (pcVar6 != (char *)0x0) {
    __n = (long)pcVar6 - (long)__s;
    if (0x3f < (long)__n) {
      uVar9 = 0x100000016;
      local_a8.ipv6_address_.scope_id_ = 0;
      iVar5 = 0;
      piVar8 = ifs.m_ptr;
      goto LAB_002c9572;
    }
    __cp = local_78;
    memcpy(__cp,__s,__n);
    *(undefined1 *)((long)local_78 + __n) = 0;
  }
  local_d0 = ifs.m_ptr;
  iVar5 = inet_pton(10,(char *)__cp,&local_b8);
  local_a8.ipv6_address_.scope_id_ = 0;
  uVar9 = 0x100000016;
  if (0 < iVar5) {
    uVar9 = local_a8.ipv6_address_.scope_id_;
  }
  if (*local_c8 != 0) {
    uVar9 = 0x100000000;
  }
  piVar8 = local_d0;
  if (0 < iVar5 && pcVar6 != (char *)0x0) {
    if (((bStack_b7 & 0xc0) == 0x80 && local_b8 == -2) || ((bStack_b7 & 0xf) == 2 && local_b8 == -1)
       ) {
      uVar3 = if_nametoindex(pcVar6 + 1);
      local_a8.ipv6_address_.scope_id_ = (unsigned_long)uVar3;
    }
    else {
      local_a8.ipv6_address_.scope_id_ = 0;
    }
    piVar8 = local_d0;
    if (local_a8.ipv6_address_.scope_id_ == 0) {
      iVar4 = atoi(pcVar6 + 1);
      local_a8.ipv6_address_.scope_id_ = (unsigned_long)iVar4;
    }
  }
LAB_002c9572:
  piVar1 = local_c8;
  if (iVar5 < 1) {
    local_78[0]._M_dataplus._M_p = (pointer)0x0;
    local_78[0]._M_string_length = 0;
    local_a8.ipv6_address_.scope_id_ = 0;
  }
  else {
    local_78[0]._M_dataplus._M_p =
         (pointer)CONCAT44(uStack_b4,CONCAT22(uStack_b6,CONCAT11(bStack_b7,local_b8)));
    local_78[0]._M_string_length = sStack_b0;
  }
  if ((uVar9 & 0x100000000) == 0) {
    local_a8.type_ = ipv6;
    local_a8.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    local_a8.ipv6_address_.addr_.__in6_u._0_8_ = local_78[0]._M_dataplus._M_p;
    local_a8.ipv6_address_.addr_.__in6_u._8_8_ = local_78[0]._M_string_length;
  }
  else {
    *local_c8 = 0;
    iVar5 = inet_pton(2,(char *)local_80,&local_b8);
    uVar9 = 0;
    if (iVar5 < 1) {
      uVar9 = 0x100000016;
    }
    if (*piVar1 != 0) {
      uVar9 = 0x100000000;
    }
    if (*piVar1 != 0 || iVar5 < 1) {
      local_a8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_a8.ipv6_address_.scope_id_ = 0;
      local_a8.type_ = ipv4;
      local_a8.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      local_a8.ipv6_address_.addr_.__in6_u._0_8_ = (pointer)0x0;
    }
    else {
      local_a8._0_8_ = (ulong)CONCAT22(uStack_b6,CONCAT11(bStack_b7,local_b8)) << 0x20;
      local_a8.ipv6_address_.addr_.__in6_u._0_8_ = (pointer)0x0;
      local_a8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_a8.ipv6_address_.scope_id_ = 0;
    }
  }
  if ((uVar9 & 0x100000000) == 0) {
    local_78[0]._M_string_length = 0;
    local_78[0].field_2._M_local_buf[0] = '\0';
    local_78[0]._M_dataplus._M_p = (pointer)&local_78[0].field_2;
    ::std::
    vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>::
    emplace_back<boost::asio::ip::address_const&,int_const&,std::__cxx11::string,libtorrent::aux::transport_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::listen_socket_flags_tag,void>&>
              (local_c0,&local_a8,(int *)(this + 0x20),local_78,(transport *)&local_d1,&local_d2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78[0]._M_dataplus._M_p != &local_78[0].field_2) {
      operator_delete(local_78[0]._M_dataplus._M_p,
                      CONCAT71(local_78[0].field_2._M_allocated_capacity._1_7_,
                               local_78[0].field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    local_d2.m_val = local_d2.m_val | 4;
    if (piVar8 != (ip_interface *)0x0) {
      lVar7 = (long)piVar8 * 400;
      do {
        iVar5 = ::std::__cxx11::string::compare((char *)this);
        if (iVar5 == 0) {
          bVar2 = 2;
          if (this[0x25] == (aux)0x0) {
            if (a->type_ == ipv4) {
              bVar10 = (char)(a->ipv4_address_).addr_.s_addr == '\x7f';
LAB_002c9739:
              if (bVar10) goto LAB_002c974a;
            }
            else if ((((((a->ipv6_address_).addr_.__in6_u.__u6_addr8[0] == '\0') &&
                       ((a->ipv6_address_).addr_.__in6_u.__u6_addr8[1] == '\0')) &&
                      ((a->ipv6_address_).addr_.__in6_u.__u6_addr8[2] == '\0')) &&
                     ((((a->ipv6_address_).addr_.__in6_u.__u6_addr8[3] == '\0' &&
                       ((a->ipv6_address_).addr_.__in6_u.__u6_addr8[4] == '\0')) &&
                      (((a->ipv6_address_).addr_.__in6_u.__u6_addr8[5] == '\0' &&
                       (((a->ipv6_address_).addr_.__in6_u.__u6_addr8[6] == '\0' &&
                        ((a->ipv6_address_).addr_.__in6_u.__u6_addr8[7] == '\0')))))))) &&
                    (((a->ipv6_address_).addr_.__in6_u.__u6_addr8[8] == '\0' &&
                     ((((((a->ipv6_address_).addr_.__in6_u.__u6_addr8[9] == '\0' &&
                         ((a->ipv6_address_).addr_.__in6_u.__u6_addr8[10] == '\0')) &&
                        ((a->ipv6_address_).addr_.__in6_u.__u6_addr8[0xb] == '\0')) &&
                       (((a->ipv6_address_).addr_.__in6_u.__u6_addr8[0xc] == '\0' &&
                        ((a->ipv6_address_).addr_.__in6_u.__u6_addr8[0xd] == '\0')))) &&
                      ((a->ipv6_address_).addr_.__in6_u.__u6_addr8[0xe] == '\0')))))) {
              bVar10 = (a->ipv6_address_).addr_.__in6_u.__u6_addr8[0xf] == '\x01';
              goto LAB_002c9739;
            }
            bVar10 = is_link_local(a);
            bVar2 = bVar10 * '\x02';
          }
LAB_002c974a:
          local_78[0]._M_dataplus._M_p._0_1_ = bVar2 | local_d2.m_val;
          ::std::
          vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
          ::
          emplace_back<boost::asio::ip::address_const&,int_const&,std::__cxx11::string_const&,libtorrent::aux::transport_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::listen_socket_flags_tag,void>>
                    (local_c0,a,(int *)(this + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (transport *)&local_d1,
                     (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> *
                     )local_78);
        }
        a = (address *)(a[0xc].ipv6_address_.addr_.__in6_u.__u6_addr8 + 8);
        lVar7 = lVar7 + -400;
      } while (lVar7 != 0);
    }
  }
  return;
}

Assistant:

void interface_to_endpoints(listen_interface_t const& iface
		, listen_socket_flags_t flags
		, span<ip_interface const> const ifs
		, std::vector<listen_endpoint_t>& eps)
	{
		flags |= iface.local ? listen_socket_t::local_network : listen_socket_flags_t{};
		transport const ssl = iface.ssl ? transport::ssl : transport::plaintext;

		// First, check to see if it's an IP address
		error_code err;
		address const adr = make_address(iface.device.c_str(), err);
		if (!err)
		{
			eps.emplace_back(adr, iface.port, std::string{}, ssl, flags);
		}
		else
		{
			flags |= listen_socket_t::was_expanded;

			// this is the case where device names a network device. We need to
			// enumerate all IPs associated with this device
			for (auto const& ipface : ifs)
			{
				// we're looking for a specific interface, and its address
				// (which must be of the same family as the address we're
				// connecting to)
				if (iface.device != ipface.name) continue;

				bool const local = iface.local
					|| ipface.interface_address.is_loopback()
					|| is_link_local(ipface.interface_address);

				eps.emplace_back(ipface.interface_address, iface.port, iface.device
					, ssl, flags | (local ? listen_socket_t::local_network : listen_socket_flags_t{}));
			}
		}
	}